

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x9c6540;
  *(undefined8 *)&this->field_0xc8 = 0x9c65e0;
  *(undefined8 *)&this->field_0x10 = 0x9c6568;
  *(undefined8 *)&this->field_0x70 = 0x9c6590;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x9c65b8;
  puVar1 = *(undefined1 **)
            &(this->
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
             field_0x20;
  if (puVar1 != &this->field_0xb0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x9c6758;
  *(undefined8 *)&this->field_0xc8 = 0x9c67a8;
  *(undefined8 *)&this->field_0x10 = 0x9c6780;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48);
  }
  if (*(void **)&this->field_0x30 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x30);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}